

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

unsigned_long xmlParserFindNodeInfoIndex(xmlParserNodeInfoSeqPtr seq,xmlNodePtr node)

{
  xmlNodePtr pxVar1;
  unsigned_long uVar2;
  ulong uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar2 = 0xffffffffffffffff;
  if (node != (xmlNodePtr)0x0 && seq != (xmlParserNodeInfoSeqPtr)0x0) {
    uVar3 = seq->length;
    if (uVar3 != 0) {
      uVar7 = 1;
      do {
        uVar6 = uVar7;
        uVar5 = uVar3 - uVar6 >> 1;
        uVar7 = (uVar6 + uVar5) - 1;
        pxVar1 = seq->buffer[uVar7].node;
        if (node < pxVar1) {
          uVar3 = uVar7;
        }
        uVar7 = uVar5 + 1 + uVar6;
        if (node <= pxVar1) {
          uVar7 = uVar6;
        }
      } while ((uVar7 <= uVar3) && (pxVar1 != node));
      uVar2 = uVar5 + uVar6;
      if (uVar2 != 0) {
        uVar4 = uVar2 - 1;
        if (seq->buffer[uVar2 - 1].node < node) {
          uVar4 = uVar2;
        }
        return uVar4;
      }
    }
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

unsigned long
xmlParserFindNodeInfoIndex(xmlParserNodeInfoSeqPtr seq,
                           xmlNodePtr node)
{
    unsigned long upper, lower, middle;
    int found = 0;

    if ((seq == NULL) || (node == NULL))
        return ((unsigned long) -1);

    /* Do a binary search for the key */
    lower = 1;
    upper = seq->length;
    middle = 0;
    while (lower <= upper && !found) {
        middle = lower + (upper - lower) / 2;
        if (node == seq->buffer[middle - 1].node)
            found = 1;
        else if (node < seq->buffer[middle - 1].node)
            upper = middle - 1;
        else
            lower = middle + 1;
    }

    /* Return position */
    if (middle == 0 || seq->buffer[middle - 1].node < node)
        return middle;
    else
        return middle - 1;
}